

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O1

btCollisionShape * __thiscall
btCollisionWorldImporter::convertCollisionShape
          (btCollisionWorldImporter *this,btCollisionShapeData *shapeData)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  btOptimizedBvh **ppbVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined4 uVar9;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  int iVar17;
  int iVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar20;
  btOptimizedBvh *pbVar21;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  btCollisionShape **__s;
  btVector3 *pbVar22;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  btCollisionShape *pbVar23;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  long lVar24;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  _func_int **pp_Var25;
  long lVar26;
  btConvexHullShapeData *convexData;
  btTransform *pbVar27;
  long lVar28;
  btAlignedObjectArray<btCollisionShape_*> *pbVar29;
  char *pcVar30;
  char *pcVar31;
  long lVar32;
  int i_1;
  long lVar33;
  int i;
  btCapsuleShape *cap;
  float fVar35;
  undefined1 auVar34 [16];
  float fVar36;
  btAlignedObjectArray<float> radii;
  btAlignedObjectArray<btVector3> tmpPoints;
  btAlignedObjectArray<btCollisionShape_*> local_98;
  undefined1 local_78 [16];
  btVector3 *local_68;
  bool local_60;
  undefined4 auStack_48 [6];
  undefined4 uVar11;
  undefined3 uVar13;
  undefined2 uVar15;
  btConvexHullShape *pbVar19;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pbVar29 = &local_98;
  uVar5 = shapeData->m_shapeType;
  if (10 < (int)uVar5) {
    switch(uVar5) {
    case 0x15:
      iVar17 = (*this->_vptr_btCollisionWorldImporter[0x13])(this,shapeData + 1);
      iVar17 = (*this->_vptr_btCollisionWorldImporter[0x18])(this,CONCAT44(extraout_var_00,iVar17));
      plVar20 = (long *)CONCAT44(extraout_var_01,iVar17);
      iVar17 = (**(code **)(*plVar20 + 0x38))(plVar20);
      if (iVar17 == 0) {
        pbVar19 = (btConvexHullShape *)0x0;
      }
      else {
        pcVar31 = shapeData[2].m_name;
        plVar20[1] = *(long *)&shapeData[1].m_shapeType;
        plVar20[2] = (long)pcVar31;
        if (shapeData[3].m_name == (char *)0x0) {
          pbVar21 = (btOptimizedBvh *)0x0;
        }
        else {
          local_78._0_8_ = shapeData[3].m_name;
          iVar18 = btHashMap<btHashPtr,_btOptimizedBvh_*>::findIndex
                             (&this->m_bvhMap,(btHashPtr *)local_78);
          ppbVar6 = (this->m_bvhMap).m_valueArray.m_data;
          if ((ppbVar6 == (btOptimizedBvh **)0x0 || iVar18 == -1) ||
             (pbVar21 = ppbVar6[iVar18], pbVar21 == (btOptimizedBvh *)0x0)) {
            iVar18 = (*this->_vptr_btCollisionWorldImporter[0x19])(this);
            pbVar21 = (btOptimizedBvh *)CONCAT44(extraout_var_02,iVar18);
            (*(pbVar21->super_btQuantizedBvh)._vptr_btQuantizedBvh[5])(pbVar21,shapeData[3].m_name);
          }
        }
        lVar24._0_4_ = shapeData[3].m_shapeType;
        lVar24._4_1_ = shapeData[3].m_padding[0];
        lVar24._5_1_ = shapeData[3].m_padding[1];
        lVar24._6_1_ = shapeData[3].m_padding[2];
        lVar24._7_1_ = shapeData[3].m_padding[3];
        if (lVar24 != 0) {
          local_78._0_8_ = lVar24;
          iVar18 = btHashMap<btHashPtr,_btOptimizedBvh_*>::findIndex
                             (&this->m_bvhMap,(btHashPtr *)local_78);
          ppbVar6 = (this->m_bvhMap).m_valueArray.m_data;
          if ((ppbVar6 == (btOptimizedBvh **)0x0 || iVar18 == -1) ||
             (pbVar21 = ppbVar6[iVar18], pbVar21 == (btOptimizedBvh *)0x0)) {
            iVar18 = (*this->_vptr_btCollisionWorldImporter[0x19])(this);
            pbVar21 = (btOptimizedBvh *)CONCAT44(extraout_var_17,iVar18);
            uVar8._0_4_ = shapeData[3].m_shapeType;
            uVar8._4_1_ = shapeData[3].m_padding[0];
            uVar8._5_1_ = shapeData[3].m_padding[1];
            uVar8._6_1_ = shapeData[3].m_padding[2];
            uVar8._7_1_ = shapeData[3].m_padding[3];
            (*(pbVar21->super_btQuantizedBvh)._vptr_btQuantizedBvh[6])(pbVar21,uVar8);
          }
        }
        iVar18 = (*this->_vptr_btCollisionWorldImporter[0x11])(this,plVar20,pbVar21);
        pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_18,iVar18);
        (*(pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
          super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
          _vptr_btCollisionShape[0xb])(shapeData[4].m_shapeType,pbVar19);
        if (shapeData[4].m_name != (char *)0x0) {
          iVar18 = (*this->_vptr_btCollisionWorldImporter[0x1a])(this);
          btTriangleInfoMap::deSerialize
                    ((btTriangleInfoMap *)CONCAT44(extraout_var_19,iVar18),
                     (btTriangleInfoMapData *)shapeData[4].m_name);
          *(btTriangleInfoMap **)
           (pbVar19->super_btPolyhedralConvexAabbCachingShape).m_localAabbMin.m_floats =
               (btTriangleInfoMap *)CONCAT44(extraout_var_19,iVar18);
        }
      }
      if (iVar17 != 0) {
        return (btCollisionShape *)pbVar19;
      }
      return (btCollisionShape *)(btConvexHullShape *)0x0;
    case 0x16:
      shapeData->m_shapeType = 0x15;
      pbVar23 = convertCollisionShape(this,shapeData);
      local_78 = *(undefined1 (*) [16])(shapeData + 5);
      iVar17 = (*this->_vptr_btCollisionWorldImporter[0x16])(this,pbVar23);
      return (btCollisionShape *)(btConvexHullShape *)CONCAT44(extraout_var_10,iVar17);
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1d:
    case 0x1e:
    case 0x20:
      return (btCollisionShape *)(btConvexHullShape *)0x0;
    case 0x1c:
      local_78 = *(undefined1 (*) [16])(shapeData + 2);
      uVar9 = shapeData[1].m_shapeType;
      uVar10 = shapeData[1].m_padding[0];
      uVar12 = shapeData[1].m_padding[1];
      uVar14 = shapeData[1].m_padding[2];
      uVar16 = shapeData[1].m_padding[3];
      uVar15 = CONCAT11(uVar16,uVar14);
      uVar13 = CONCAT21(uVar15,uVar12);
      uVar11 = CONCAT31(uVar13,uVar10);
      local_98._0_4_ = SUB84(shapeData[1].m_name,0);
      local_98.m_size = (int)((ulong)shapeData[1].m_name >> 0x20);
      local_98.m_capacity = uVar9;
      local_98._12_4_ = uVar11;
      iVar17 = (*this->_vptr_btCollisionWorldImporter[4])(*(undefined4 *)&shapeData[3].m_name,this);
      pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_09,iVar17);
      pp_Var25 = (pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
                 super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
                 _vptr_btCollisionShape;
      break;
    case 0x1f:
      iVar17 = (*this->_vptr_btCollisionWorldImporter[0x15])(this);
      local_98.m_ownsMemory = true;
      local_98.m_data = (btCollisionShape **)0x0;
      local_98.m_size = 0;
      local_98.m_capacity = 0;
      if (0 < shapeData[1].m_shapeType) {
        lVar26 = 0;
        lVar24 = 0;
        do {
          pbVar23 = convertCollisionShape
                              (this,*(btCollisionShapeData **)
                                     (shapeData[1].m_name + lVar24 * 0x50 + 0x40));
          if (pbVar23 != (btCollisionShape *)0x0) {
            pcVar30 = shapeData[1].m_name;
            pcVar31 = pcVar30 + lVar26;
            lVar32 = 0;
            pbVar27 = (btTransform *)local_78;
            do {
              lVar28 = 0;
              do {
                (pbVar27->m_basis).m_el[0].m_floats[lVar28] = *(btScalar *)(pcVar31 + lVar28 * 4);
                lVar28 = lVar28 + 1;
              } while (lVar28 != 4);
              lVar32 = lVar32 + 1;
              pbVar27 = (btTransform *)((pbVar27->m_basis).m_el + 1);
              pcVar31 = pcVar31 + 0x10;
            } while (lVar32 != 3);
            lVar32 = 0xc;
            do {
              *(undefined4 *)(local_78 + lVar32 * 4) =
                   *(undefined4 *)(pcVar30 + lVar32 * 4 + lVar26);
              lVar32 = lVar32 + 1;
            } while (lVar32 != 0x10);
            btCompoundShape::addChildShape
                      ((btCompoundShape *)CONCAT44(extraout_var_08,iVar17),(btTransform *)local_78,
                       pbVar23);
          }
          lVar24 = lVar24 + 1;
          lVar26 = lVar26 + 0x50;
        } while (lVar24 < shapeData[1].m_shapeType);
      }
      btAlignedObjectArray<btCollisionShape_*>::~btAlignedObjectArray(&local_98);
      return (btCollisionShape *)(btConvexHullShape *)CONCAT44(extraout_var_08,iVar17);
    default:
      if ((uVar5 != 0xb) && (uVar5 != 0xd)) {
        return (btCollisionShape *)(btConvexHullShape *)0x0;
      }
      goto LAB_001480b0;
    }
    goto LAB_001487f7;
  }
  if ((int)uVar5 < 8) {
    if ((uVar5 != 0) && (uVar5 != 4)) {
      return (btCollisionShape *)(btConvexHullShape *)0x0;
    }
  }
  else if (1 < uVar5 - 8) {
    if (uVar5 != 10) {
      return (btCollisionShape *)(btConvexHullShape *)0x0;
    }
    iVar17 = shapeData[3].m_shapeType;
    if (iVar17 == 2) {
      iVar17 = (*this->_vptr_btCollisionWorldImporter[9])(0x3f800000,0x3f800000,this);
      pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_12,iVar17);
    }
    else if (iVar17 == 1) {
      iVar17 = (*this->_vptr_btCollisionWorldImporter[8])(0x3f800000,0x3f800000,this);
      pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_11,iVar17);
    }
    else if (iVar17 == 0) {
      iVar17 = (*this->_vptr_btCollisionWorldImporter[7])(0x3f800000,0x3f800000,this);
      pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var,iVar17);
    }
    else {
      puts("error: wrong up axis for btCapsuleShape");
      pbVar19 = (btConvexHullShape *)0x0;
    }
    if (pbVar19 == (btConvexHullShape *)0x0) {
      return (btCollisionShape *)(btConvexHullShape *)0x0;
    }
    lVar24 = 8;
    do {
      *(undefined4 *)
       ((long)(&(pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
                super_btConvexInternalShape.m_implicitShapeDimensions + -2) + lVar24 * 4) =
           *(undefined4 *)(shapeData->m_padding + lVar24 * 4 + -0xc);
      lVar24 = lVar24 + 1;
    } while (lVar24 != 0xc);
    (pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
    super_btConvexInternalShape.m_collisionMargin = *(btScalar *)&shapeData[3].m_name;
    lVar24 = 4;
    do {
      *(undefined4 *)
       ((long)(&(pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
                super_btConvexInternalShape.m_implicitShapeDimensions + -2) + lVar24 * 4) =
           *(undefined4 *)(shapeData->m_padding + lVar24 * 4 + -0xc);
      lVar24 = lVar24 + 1;
    } while (lVar24 != 8);
    *(int *)&(pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
             super_btConvexInternalShape.field_0x44 = shapeData[3].m_shapeType;
    return (btCollisionShape *)pbVar19;
  }
LAB_001480b0:
  if (0xd < uVar5) {
switchD_001480d8_caseD_1:
    pbVar19 = (btConvexHullShape *)0x0;
    printf("error: cannot create shape type (%d)\n");
    goto LAB_001487cd;
  }
  pcVar31 = shapeData[2].m_name;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = pcVar31;
  fVar3 = (float)shapeData[2].m_shapeType;
  fVar4 = *(float *)&shapeData[3].m_name;
  fVar36 = SUB84(pcVar31,0);
  fVar35 = (float)((ulong)pcVar31 >> 0x20);
  switch(uVar5) {
  case 0:
    auVar7._8_8_ = 0;
    auVar7._0_8_ = shapeData[1].m_name;
    auVar34 = divps(auVar34,auVar7);
    local_78._4_4_ = fVar4 + auVar34._4_4_;
    local_78._0_4_ = fVar4 + auVar34._0_4_;
    local_78._8_4_ = fVar3 / (float)shapeData[1].m_shapeType + fVar4;
    local_78._12_4_ = 0.0;
    iVar17 = (*this->_vptr_btCollisionWorldImporter[5])(this);
    pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_03,iVar17);
    break;
  default:
    goto switchD_001480d8_caseD_1;
  case 4:
    iVar17 = shapeData[4].m_shapeType;
    lVar24 = (long)iVar17;
    local_60 = true;
    local_68 = (btVector3 *)0x0;
    local_78._4_8_ = 0;
    if (0 < lVar24) {
      pbVar22 = (btVector3 *)btAlignedAllocInternal(lVar24 << 4,0x10);
      if (0 < (long)(int)local_78._4_4_) {
        lVar26 = 0;
        do {
          puVar1 = (undefined8 *)((long)local_68->m_floats + lVar26);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)pbVar22->m_floats + lVar26);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          lVar26 = lVar26 + 0x10;
        } while ((long)(int)local_78._4_4_ * 0x10 != lVar26);
      }
      if ((local_68 != (btVector3 *)0x0) && (local_60 == true)) {
        btAlignedFreeInternal(local_68);
      }
      local_78._8_4_ = iVar17;
      local_68 = pbVar22;
    }
    local_60 = true;
    local_78._4_4_ = iVar17;
    if (0 < iVar17) {
      lVar26._0_4_ = shapeData[3].m_shapeType;
      lVar26._4_1_ = shapeData[3].m_padding[0];
      lVar26._5_1_ = shapeData[3].m_padding[1];
      lVar26._6_1_ = shapeData[3].m_padding[2];
      lVar26._7_1_ = shapeData[3].m_padding[3];
      pcVar31 = shapeData[4].m_name;
      lVar28 = 0;
      pbVar22 = local_68;
      pcVar30 = pcVar31;
      lVar32 = lVar26;
      do {
        if (lVar26 != 0) {
          lVar33 = 0;
          do {
            pbVar22->m_floats[lVar33] = *(btScalar *)(lVar32 + lVar33 * 4);
            lVar33 = lVar33 + 1;
          } while (lVar33 != 4);
        }
        if (pcVar31 != (char *)0x0) {
          lVar33 = 0;
          do {
            *(ulong *)(pbVar22->m_floats + lVar33) =
                 CONCAT44((float)*(double *)((long)(pcVar30 + lVar33 * 8) + 8),
                          (float)*(double *)(pcVar30 + lVar33 * 8));
            lVar33 = lVar33 + 2;
          } while (lVar33 != 4);
        }
        lVar28 = lVar28 + 1;
        pbVar22 = pbVar22 + 1;
        lVar32 = lVar32 + 0x10;
        pcVar30 = pcVar30 + 0x20;
      } while (lVar28 != lVar24);
    }
    iVar18 = (*this->_vptr_btCollisionWorldImporter[0x14])(this);
    pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_06,iVar18);
    if (0 < iVar17) {
      lVar26 = 0;
      do {
        btConvexHullShape::addPoint(pbVar19,(btVector3 *)((long)local_68->m_floats + lVar26),true);
        lVar26 = lVar26 + 0x10;
      } while (lVar24 * 0x10 != lVar26);
    }
    (*(pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
      super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape
      [0xb])(*(undefined4 *)&shapeData[3].m_name,pbVar19);
    goto LAB_001487c3;
  case 8:
    iVar17 = (*this->_vptr_btCollisionWorldImporter[6])(fVar36,this);
    pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_04,iVar17);
    break;
  case 9:
    uVar5 = *(uint *)&shapeData[4].m_name;
    lVar24 = (long)(int)uVar5;
    local_60 = true;
    local_68 = (btVector3 *)0x0;
    local_78._4_8_ = 0;
    local_98.m_ownsMemory = true;
    local_98.m_data = (btCollisionShape **)0x0;
    local_98.m_size = 0;
    local_98.m_capacity = 0;
    if ((-1 < lVar24) && (uVar5 != 0)) {
      __s = (btCollisionShape **)btAlignedAllocInternal(lVar24 * 4,0x10);
      if (0 < (long)local_98.m_size) {
        lVar26 = 0;
        do {
          *(undefined4 *)((long)__s + lVar26 * 4) =
               *(undefined4 *)((long)local_98.m_data + lVar26 * 4);
          lVar26 = lVar26 + 1;
        } while (local_98.m_size != lVar26);
      }
      if ((local_98.m_data != (btCollisionShape **)0x0) && (local_98.m_ownsMemory == true)) {
        btAlignedFreeInternal(local_98.m_data);
      }
      local_98.m_ownsMemory = true;
      local_98.m_capacity = uVar5;
      local_98.m_data = __s;
      if (uVar5 != 0) {
        memset(__s,0,lVar24 * 4);
      }
    }
    local_98.m_size = uVar5;
    if ((((int)local_78._4_4_ <= (int)uVar5) && ((int)local_78._4_4_ < (int)uVar5)) &&
       ((int)local_78._8_4_ < (int)uVar5)) {
      if (uVar5 == 0) {
        pbVar22 = (btVector3 *)0x0;
      }
      else {
        pbVar22 = (btVector3 *)btAlignedAllocInternal(lVar24 << 4,0x10);
      }
      if (0 < (long)(int)local_78._4_4_) {
        lVar26 = 0;
        do {
          puVar1 = (undefined8 *)((long)local_68->m_floats + lVar26);
          uVar8 = puVar1[1];
          puVar2 = (undefined8 *)((long)pbVar22->m_floats + lVar26);
          *puVar2 = *puVar1;
          puVar2[1] = uVar8;
          lVar26 = lVar26 + 0x10;
        } while ((long)(int)local_78._4_4_ * 0x10 != lVar26);
      }
      if ((local_68 != (btVector3 *)0x0) && (local_60 == true)) {
        btAlignedFreeInternal(local_68);
      }
      local_60 = true;
      local_78._8_4_ = uVar5;
      local_68 = pbVar22;
    }
    local_78._4_4_ = uVar5;
    if (0 < (int)uVar5) {
      lVar26 = *(long *)&shapeData[3].m_shapeType;
      lVar28 = 0;
      pbVar22 = local_68;
      lVar32 = lVar26;
      do {
        lVar33 = 0;
        do {
          pbVar22->m_floats[lVar33] = *(btScalar *)(lVar32 + lVar33 * 4);
          lVar33 = lVar33 + 1;
        } while (lVar33 != 4);
        *(undefined4 *)((long)local_98.m_data + lVar28 * 4) =
             *(undefined4 *)(lVar26 + 0x10 + lVar28 * 0x14);
        lVar28 = lVar28 + 1;
        pbVar22 = pbVar22 + 1;
        lVar32 = lVar32 + 0x14;
      } while (lVar28 != lVar24);
    }
    iVar17 = (*this->_vptr_btCollisionWorldImporter[0x17])
                       (this,local_68,local_98.m_data,(ulong)uVar5);
    pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_20,iVar17);
    btAlignedObjectArray<float>::~btAlignedObjectArray((btAlignedObjectArray<float> *)&local_98);
LAB_001487c3:
    btAlignedObjectArray<btVector3>::~btAlignedObjectArray
              ((btAlignedObjectArray<btVector3> *)local_78);
    break;
  case 0xb:
    iVar17 = shapeData[3].m_shapeType;
    if (iVar17 == 2) {
      iVar17 = (*this->_vptr_btCollisionWorldImporter[0xf])(fVar36,(ulong)(uint)fVar3,this);
      pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_16,iVar17);
    }
    else if (iVar17 == 1) {
      iVar17 = (*this->_vptr_btCollisionWorldImporter[0xe])(fVar36,CONCAT44(fVar35,fVar35),this);
      pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_15,iVar17);
    }
    else if (iVar17 == 0) {
      iVar17 = (*this->_vptr_btCollisionWorldImporter[0xd])(fVar35,pcVar31,this);
      pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_07,iVar17);
    }
    else {
      pcVar31 = "unknown Cone up axis";
LAB_0014862a:
      puts(pcVar31);
      pbVar19 = (btConvexHullShape *)0x0;
    }
    break;
  case 0xd:
    fVar36 = fVar4 + fVar36;
    iVar17 = shapeData[3].m_shapeType;
    if (iVar17 == 2) {
      iVar17 = (*this->_vptr_btCollisionWorldImporter[0xc])
                         (fVar36,(ulong)(uint)(fVar4 + fVar3),this);
      pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_14,iVar17);
    }
    else if (iVar17 == 1) {
      iVar17 = (*this->_vptr_btCollisionWorldImporter[0xb])(fVar36,this);
      pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_13,iVar17);
    }
    else {
      if (iVar17 != 0) {
        pcVar31 = "unknown Cylinder up axis";
        goto LAB_0014862a;
      }
      iVar17 = (*this->_vptr_btCollisionWorldImporter[10])(fVar4 + fVar35,(ulong)(uint)fVar36,this);
      pbVar19 = (btConvexHullShape *)CONCAT44(extraout_var_05,iVar17);
    }
  }
LAB_001487cd:
  if (pbVar19 != (btConvexHullShape *)0x0) {
    (*(pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
      super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape
      [0xb])(*(undefined4 *)&shapeData[3].m_name,pbVar19);
    local_78 = *(undefined1 (*) [16])(shapeData + 1);
    pbVar29 = (btAlignedObjectArray<btCollisionShape_*> *)local_78;
    pp_Var25 = (pbVar19->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
               super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
               _vptr_btCollisionShape;
LAB_001487f7:
    (*pp_Var25[6])(pbVar19,pbVar29);
  }
  return (btCollisionShape *)pbVar19;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::convertCollisionShape(  btCollisionShapeData* shapeData  )
{
	btCollisionShape* shape = 0;

	switch (shapeData->m_shapeType)
		{
	case STATIC_PLANE_PROXYTYPE:
		{
			btStaticPlaneShapeData* planeData = (btStaticPlaneShapeData*)shapeData;
			btVector3 planeNormal,localScaling;
			planeNormal.deSerializeFloat(planeData->m_planeNormal);
			localScaling.deSerializeFloat(planeData->m_localScaling);
			shape = createPlaneShape(planeNormal,planeData->m_planeConstant);
			shape->setLocalScaling(localScaling);

			break;
		}
	case SCALED_TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			btScaledTriangleMeshShapeData* scaledMesh = (btScaledTriangleMeshShapeData*) shapeData;
			btCollisionShapeData* colShapeData = (btCollisionShapeData*) &scaledMesh->m_trimeshShapeData;
			colShapeData->m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
			btCollisionShape* childShape = convertCollisionShape(colShapeData);
			btBvhTriangleMeshShape* meshShape = (btBvhTriangleMeshShape*)childShape;
			btVector3 localScaling;
			localScaling.deSerializeFloat(scaledMesh->m_localScaling);

			shape = createScaledTrangleMeshShape(meshShape, localScaling);
			break;
		}
#ifdef SUPPORT_GIMPACT_SHAPE_IMPORT
	case GIMPACT_SHAPE_PROXYTYPE:
		{
			btGImpactMeshShapeData* gimpactData = (btGImpactMeshShapeData*) shapeData;
			if (gimpactData->m_gimpactSubType == CONST_GIMPACT_TRIMESH_SHAPE)
			{
				btStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&gimpactData->m_meshInterface);
				btTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);


				btGImpactMeshShape* gimpactShape = createGimpactShape(meshInterface);
				btVector3 localScaling;
				localScaling.deSerializeFloat(gimpactData->m_localScaling);
				gimpactShape->setLocalScaling(localScaling);
				gimpactShape->setMargin(btScalar(gimpactData->m_collisionMargin));
				gimpactShape->updateBound();
				shape = gimpactShape;
			} else
			{
				printf("unsupported gimpact sub type\n");
			}
			break;
		}
#endif //SUPPORT_GIMPACT_SHAPE_IMPORT
	//The btCapsuleShape* API has issue passing the margin/scaling/halfextents unmodified through the API
	//so deal with this
		case CAPSULE_SHAPE_PROXYTYPE:
		{
			btCapsuleShapeData* capData = (btCapsuleShapeData*)shapeData;


			switch (capData->m_upAxis)
			{
			case 0:
				{
					shape = createCapsuleShapeX(1,1);
					break;
				}
			case 1:
				{
					shape = createCapsuleShapeY(1,1);
					break;
				}
			case 2:
				{
					shape = createCapsuleShapeZ(1,1);
					break;
				}
			default:
				{
					printf("error: wrong up axis for btCapsuleShape\n");
				}


			};
			if (shape)
			{
				btCapsuleShape* cap = (btCapsuleShape*) shape;
				cap->deSerializeFloat(capData);
			}
			break;
		}
		case CYLINDER_SHAPE_PROXYTYPE:
		case CONE_SHAPE_PROXYTYPE:
		case BOX_SHAPE_PROXYTYPE:
		case SPHERE_SHAPE_PROXYTYPE:
		case MULTI_SPHERE_SHAPE_PROXYTYPE:
		case CONVEX_HULL_SHAPE_PROXYTYPE:
			{
				btConvexInternalShapeData* bsd = (btConvexInternalShapeData*)shapeData;
				btVector3 implicitShapeDimensions;
				implicitShapeDimensions.deSerializeFloat(bsd->m_implicitShapeDimensions);
				btVector3 localScaling;
				localScaling.deSerializeFloat(bsd->m_localScaling);
				btVector3 margin(bsd->m_collisionMargin,bsd->m_collisionMargin,bsd->m_collisionMargin);
				switch (shapeData->m_shapeType)
				{
					case BOX_SHAPE_PROXYTYPE:
						{
							btBoxShape* box= (btBoxShape*)createBoxShape(implicitShapeDimensions/localScaling+margin);
							//box->initializePolyhedralFeatures();
							shape = box;

							break;
						}
					case SPHERE_SHAPE_PROXYTYPE:
						{
							shape = createSphereShape(implicitShapeDimensions.getX());
							break;
						}

					case CYLINDER_SHAPE_PROXYTYPE:
						{
							btCylinderShapeData* cylData = (btCylinderShapeData*) shapeData;
							btVector3 halfExtents = implicitShapeDimensions+margin;
							switch (cylData->m_upAxis)
							{
							case 0:
								{
									shape = createCylinderShapeX(halfExtents.getY(),halfExtents.getX());
									break;
								}
							case 1:
								{
									shape = createCylinderShapeY(halfExtents.getX(),halfExtents.getY());
									break;
								}
							case 2:
								{
									shape = createCylinderShapeZ(halfExtents.getX(),halfExtents.getZ());
									break;
								}
							default:
								{
									printf("unknown Cylinder up axis\n");
								}

							};



							break;
						}
					case CONE_SHAPE_PROXYTYPE:
						{
							btConeShapeData* conData = (btConeShapeData*) shapeData;
							btVector3 halfExtents = implicitShapeDimensions;//+margin;
							switch (conData->m_upIndex)
							{
							case 0:
								{
									shape = createConeShapeX(halfExtents.getY(),halfExtents.getX());
									break;
								}
							case 1:
								{
									shape = createConeShapeY(halfExtents.getX(),halfExtents.getY());
									break;
								}
							case 2:
								{
									shape = createConeShapeZ(halfExtents.getX(),halfExtents.getZ());
									break;
								}
							default:
								{
									printf("unknown Cone up axis\n");
								}

							};



							break;
						}
					case MULTI_SPHERE_SHAPE_PROXYTYPE:
						{
							btMultiSphereShapeData* mss = (btMultiSphereShapeData*)bsd;
							int numSpheres = mss->m_localPositionArraySize;

							btAlignedObjectArray<btVector3> tmpPos;
							btAlignedObjectArray<btScalar> radii;
							radii.resize(numSpheres);
							tmpPos.resize(numSpheres);
							int i;
							for ( i=0;i<numSpheres;i++)
							{
								tmpPos[i].deSerializeFloat(mss->m_localPositionArrayPtr[i].m_pos);
								radii[i] = mss->m_localPositionArrayPtr[i].m_radius;
							}
							shape = createMultiSphereShape(&tmpPos[0],&radii[0],numSpheres);
							break;
						}
					case CONVEX_HULL_SHAPE_PROXYTYPE:
						{
						//	int sz = sizeof(btConvexHullShapeData);
						//	int sz2 = sizeof(btConvexInternalShapeData);
						//	int sz3 = sizeof(btCollisionShapeData);
							btConvexHullShapeData* convexData = (btConvexHullShapeData*)bsd;
							int numPoints = convexData->m_numUnscaledPoints;

							btAlignedObjectArray<btVector3> tmpPoints;
							tmpPoints.resize(numPoints);
							int i;
							for ( i=0;i<numPoints;i++)
							{
#ifdef BT_USE_DOUBLE_PRECISION
							if (convexData->m_unscaledPointsDoublePtr)
								tmpPoints[i].deSerialize(convexData->m_unscaledPointsDoublePtr[i]);
							if (convexData->m_unscaledPointsFloatPtr)
								tmpPoints[i].deSerializeFloat(convexData->m_unscaledPointsFloatPtr[i]);
#else
							if (convexData->m_unscaledPointsFloatPtr)
								tmpPoints[i].deSerialize(convexData->m_unscaledPointsFloatPtr[i]);
							if (convexData->m_unscaledPointsDoublePtr)
								tmpPoints[i].deSerializeDouble(convexData->m_unscaledPointsDoublePtr[i]);
#endif //BT_USE_DOUBLE_PRECISION
							}
							btConvexHullShape* hullShape = createConvexHullShape();
							for (i=0;i<numPoints;i++)
							{
								hullShape->addPoint(tmpPoints[i]);
							}
							hullShape->setMargin(bsd->m_collisionMargin);
							//hullShape->initializePolyhedralFeatures();
							shape = hullShape;
							break;
						}
					default:
						{
							printf("error: cannot create shape type (%d)\n",shapeData->m_shapeType);
						}
				}

				if (shape)
				{
					shape->setMargin(bsd->m_collisionMargin);

					btVector3 localScaling;
					localScaling.deSerializeFloat(bsd->m_localScaling);
					shape->setLocalScaling(localScaling);

				}
				break;
			}
		case TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			btTriangleMeshShapeData* trimesh = (btTriangleMeshShapeData*)shapeData;
			btStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&trimesh->m_meshInterface);
			btTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);
			if (!meshInterface->getNumSubParts())
			{
				return 0;
			}

			btVector3 scaling; scaling.deSerializeFloat(trimesh->m_meshInterface.m_scaling);
			meshInterface->setScaling(scaling);


			btOptimizedBvh* bvh = 0;
#if 1
			if (trimesh->m_quantizedFloatBvh)
			{
				btOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedFloatBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				} else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeFloat(*trimesh->m_quantizedFloatBvh);
				}
			}
			if (trimesh->m_quantizedDoubleBvh)
			{
				btOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedDoubleBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				} else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeDouble(*trimesh->m_quantizedDoubleBvh);
				}
			}
#endif


			btBvhTriangleMeshShape* trimeshShape = createBvhTriangleMeshShape(meshInterface,bvh);
			trimeshShape->setMargin(trimesh->m_collisionMargin);
			shape = trimeshShape;

			if (trimesh->m_triangleInfoMap)
			{
				btTriangleInfoMap* map = createTriangleInfoMap();
				map->deSerialize(*trimesh->m_triangleInfoMap);
				trimeshShape->setTriangleInfoMap(map);

#ifdef USE_INTERNAL_EDGE_UTILITY
				gContactAddedCallback = btAdjustInternalEdgeContactsCallback;
#endif //USE_INTERNAL_EDGE_UTILITY

			}

			//printf("trimesh->m_collisionMargin=%f\n",trimesh->m_collisionMargin);
			break;
		}
		case COMPOUND_SHAPE_PROXYTYPE:
			{
				btCompoundShapeData* compoundData = (btCompoundShapeData*)shapeData;
				btCompoundShape* compoundShape = createCompoundShape();

				btCompoundShapeChildData* childShapeDataArray = &compoundData->m_childShapePtr[0];


				btAlignedObjectArray<btCollisionShape*> childShapes;
				for (int i=0;i<compoundData->m_numChildShapes;i++)
				{
					btCompoundShapeChildData* ptr = &compoundData->m_childShapePtr[i];

					btCollisionShapeData* cd = compoundData->m_childShapePtr[i].m_childShape;

					btCollisionShape* childShape = convertCollisionShape(cd);
					if (childShape)
					{
						btTransform localTransform;
						localTransform.deSerializeFloat(compoundData->m_childShapePtr[i].m_transform);
						compoundShape->addChildShape(localTransform,childShape);
					} else
					{
#ifdef _DEBUG
						printf("error: couldn't create childShape for compoundShape\n");
#endif
					}

				}
				shape = compoundShape;

				break;
			}
		case SOFTBODY_SHAPE_PROXYTYPE:
			{
				return 0;
			}
		default:
			{
#ifdef _DEBUG
				printf("unsupported shape type (%d)\n",shapeData->m_shapeType);
#endif
			}
		}

		return shape;

}